

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,REF_INT node)

{
  REF_INT cell;
  int iVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  REF_NODE pRVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  REF_INT ncell;
  REF_INT cell_list [10];
  REF_INT ns [27];
  REF_INT nodes [27];
  int local_15c;
  REF_NODE local_158;
  long local_150;
  uint local_148 [12];
  uint local_118;
  uint local_114;
  uint local_110;
  undefined4 local_10c;
  REF_INT local_a8 [3];
  uint local_9c;
  
  if (node < 0) {
    return 0;
  }
  ref_cell = ref_grid->cell[3];
  pRVar2 = ref_cell->ref_adj;
  if (pRVar2->nnode <= node) {
    return 0;
  }
  lVar9 = (long)pRVar2->first[(uint)node];
  if (lVar9 == -1) {
    return 0;
  }
  pRVar7 = ref_grid->node;
  cell = pRVar2->item[lVar9].ref;
  uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
  do {
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x68,"ref_validation_boundary_at_node",(ulong)uVar4,"get cell");
      return uVar4;
    }
    local_158 = pRVar7;
    local_150 = lVar9;
    if (0 < ref_cell->edge_per) {
      lVar9 = 0;
      do {
        lVar8 = (long)ref_cell->size_per * (long)cell;
        uVar4 = ref_cell->c2n[ref_cell->e2n[lVar9 * 2] + lVar8];
        uVar6 = ref_cell->c2n[(long)(int)lVar8 + (long)ref_cell->e2n[lVar9 * 2 + 1]];
        iVar1 = pRVar7->ref_mpi->id;
        if ((iVar1 == pRVar7->part[(int)uVar4]) || (iVar1 == pRVar7->part[(int)uVar6])) {
          uVar5 = ref_cell_list_with2(ref_cell,uVar4,uVar6,10,&local_15c,(REF_INT *)local_148);
          pRVar7 = local_158;
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x73,"ref_validation_boundary_at_node",(ulong)uVar5,
                   "more than ten triangles found with two nodes");
            printf("nodes %d %d faceid %d\n",(ulong)uVar4,(ulong)uVar6,(ulong)local_9c);
            pRVar7 = local_158;
            ref_node_location(local_158,uVar4);
            ref_node_location(pRVar7,uVar6);
            return uVar5;
          }
          lVar8 = (long)local_15c;
          if (lVar8 != 2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x7e,"ref_validation_boundary_at_node","two triangles expected",2,lVar8);
            printf("nodes %d %d faceid %d\n",(ulong)uVar4,(ulong)uVar6,(ulong)local_9c);
            ref_node_location(pRVar7,uVar4);
            ref_node_location(pRVar7,uVar6);
            if (local_15c < 1) {
              return 1;
            }
            uVar10 = 0;
            do {
              uVar4 = local_148[uVar10];
              uVar6 = ref_cell_nodes(ref_cell,uVar4,(REF_INT *)&local_118);
              if (uVar6 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                       ,0x7a,"ref_validation_boundary_at_node",(ulong)uVar6,"get cell",lVar8);
                return uVar6;
              }
              lVar8 = CONCAT44((int)((ulong)lVar8 >> 0x20),local_10c);
              printf(" item %d cell %d nodes %d %d %d id %d\n",uVar10 & 0xffffffff,(ulong)uVar4,
                     (ulong)local_118,(ulong)local_114,(ulong)local_110,lVar8);
              uVar10 = uVar10 + 1;
            } while ((long)uVar10 < (long)local_15c);
            return 1;
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < ref_cell->edge_per);
    }
    pRVar3 = ref_cell->ref_adj->item;
    lVar9 = (long)pRVar3[(int)local_150].next;
    if (lVar9 == -1) {
      return 0;
    }
    cell = pRVar3[lVar9].ref;
    uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
    pRVar7 = local_158;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_boundary_at_node(REF_GRID ref_grid,
                                                   REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_edge, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT i, c, ns[REF_CELL_MAX_SIZE_PER];
  REF_INT node0, node1, ncell, cell_list[10];

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get cell");
    each_ref_cell_cell_edge(ref_cell, cell_edge) {
      node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
      node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
      if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1))
        continue;
      RSB(ref_cell_list_with2(ref_cell, node0, node1, 10, &ncell, cell_list),
          "more than ten triangles found with two nodes", {
            printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
            ref_node_location(ref_node, node0);
            ref_node_location(ref_node, node1);
          });
      REIB(2, ncell, "two triangles expected", {
        printf("nodes %d %d faceid %d\n", node0, node1, nodes[3]);
        ref_node_location(ref_node, node0);
        ref_node_location(ref_node, node1);
        for (i = 0; i < ncell; i++) {
          c = cell_list[i];
          RSS(ref_cell_nodes(ref_cell, c, ns), "get cell");
          printf(" item %d cell %d nodes %d %d %d id %d\n", i, c, ns[0], ns[1],
                 ns[2], ns[3]);
        }
      });
    }
  }

  return REF_SUCCESS;
}